

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Diagnostic * __thiscall
slang::ast::Compilation::errorMissingDef
          (Compilation *this,string_view name,Scope *scope,SourceRange sourceRange,DiagCode code)

{
  SourceRange range;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view name_00;
  bool bVar1;
  SyntaxNode *this_00;
  Diagnostic *pDVar2;
  Token *in_RCX;
  Diagnostic *in_RDI;
  undefined4 in_stack_00000008;
  Scope *in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  DiagCode in_stack_00000034;
  Diagnostic *diag;
  Diagnostic *diag_1;
  SyntaxNode *def;
  Compilation *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  bitmask<slang::ast::CompilationFlags> flags;
  SourceLocation in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  DiagCode noteCode;
  Scope *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  size_t in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  Scope *in_stack_ffffffffffffff50;
  Compilation *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  bitmask<slang::ast::CompilationFlags> local_3c;
  Token *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  noteCode = SUB84((ulong)in_stack_ffffffffffffff10 >> 0x20,0);
  local_38 = in_RCX;
  bitmask<slang::ast::CompilationFlags>::bitmask(&local_3c,IgnoreUnknownModules);
  bVar1 = hasFlag(in_stack_fffffffffffffed8,flags);
  if (((!bVar1) && (bVar1 = Scope::isUninstantiated(in_stack_ffffffffffffff18), !bVar1)) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), !bVar1)) {
    name_00._M_str = in_stack_ffffffffffffff68;
    name_00._M_len = in_stack_ffffffffffffff60;
    this_00 = getExternDefinition(in_stack_ffffffffffffff58,name_00,in_stack_ffffffffffffff50);
    if (this_00 != (SyntaxNode *)0x0) {
      getExternNameToken((SyntaxNode *)in_stack_fffffffffffffed8);
      parsing::Token::range((Token *)in_stack_ffffffffffffff00);
      pDVar2 = Scope::addDiag(in_stack_00000018,in_stack_00000034,(SourceRange)in_stack_00000020);
      if (this_00->kind == ExternModuleDecl) {
        slang::syntax::SyntaxNode::as<slang::syntax::ExternModuleDeclSyntax>(this_00);
        not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                  ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x5269f6);
        parsing::Token::valueText(local_38);
        arg._M_str = in_stack_ffffffffffffff30;
        arg._M_len = in_stack_ffffffffffffff28;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),arg);
      }
      else {
        sv((char *)pDVar2,(size_t)in_stack_fffffffffffffed8);
        arg_00._M_str = in_stack_ffffffffffffff30;
        arg_00._M_len = in_stack_ffffffffffffff28;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   arg_00);
      }
      arg_01._M_str = in_stack_ffffffffffffff30;
      arg_01._M_len = in_stack_ffffffffffffff28;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),arg_01)
      ;
      range.endLoc = in_stack_ffffffffffffff08;
      range.startLoc = in_stack_ffffffffffffff00;
      Diagnostic::addNote(in_RDI,noteCode,range);
      return pDVar2;
    }
    Scope::addDiag(in_stack_00000018,in_stack_00000034,(SourceRange)in_stack_00000020);
    arg_02._M_str = in_stack_ffffffffffffff30;
    arg_02._M_len = in_stack_ffffffffffffff28;
    pDVar2 = Diagnostic::operator<<
                       ((Diagnostic *)CONCAT44(in_stack_00000008,in_stack_ffffffffffffff20),arg_02);
    return pDVar2;
  }
  return (Diagnostic *)0x0;
}

Assistant:

Diagnostic* Compilation::errorMissingDef(std::string_view name, const Scope& scope,
                                         SourceRange sourceRange, DiagCode code) const {
    if (hasFlag(CompilationFlags::IgnoreUnknownModules) || scope.isUninstantiated() || name.empty())
        return nullptr;

    if (auto def = getExternDefinition(name, scope)) {
        auto& diag = scope.addDiag(diag::MissingExternModuleImpl, getExternNameToken(*def).range());
        if (def->kind == SyntaxKind::ExternModuleDecl)
            diag << def->as<ExternModuleDeclSyntax>().header->moduleKeyword.valueText();
        else
            diag << "primitive"sv;

        diag << name;
        diag.addNote(diag::NoteReferencedHere, sourceRange);
        return &diag;
    }

    auto& diag = scope.addDiag(code, sourceRange) << name;
    return &diag;
}